

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int vm_builtin_utf8_decode(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uchar *zTerm;
  int c;
  uchar *zIn;
  int nByte;
  int local_34;
  uchar *local_30;
  int local_24;
  
  if (0 < nArg) {
    local_30 = (uchar *)jx9_value_to_string(*apArg,&local_24);
    if (0 < (long)local_24) {
      zTerm = local_30 + local_24;
      do {
        local_34 = jx9Utf8Read(local_30,zTerm,&local_30);
        if (local_34 == 0) {
          return 0;
        }
        jx9_value_string(pCtx->pRet,(char *)&local_34,1);
      } while (local_30 < zTerm);
      return 0;
    }
  }
  jx9MemObjRelease(pCtx->pRet);
  return 0;
}

Assistant:

static int vm_builtin_utf8_decode(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const unsigned char *zIn, *zEnd;
	int nByte, c;
	if( nArg < 1 ){
		/* Missing arguments, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zIn = (const unsigned char *)jx9_value_to_string(apArg[0], &nByte);
	if( nByte < 1 ){
		/* Empty string, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	zEnd = &zIn[nByte];
	/* Start the decoding process */
	while( zIn < zEnd ){
		c = jx9Utf8Read(zIn, zEnd, &zIn);
		if( c == 0x0 ){
			break;
		}
		jx9_result_string(pCtx, (const char *)&c, (int)sizeof(char));
	}
	return JX9_OK;
}